

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O1

Slice * Imf_3_4::Slice::Make
                  (Slice *__return_storage_ptr__,PixelType type,void *ptr,Box2i *dataWindow,
                  size_t xStride,size_t yStride,int xSampling,int ySampling,double fillValue,
                  bool xTileCoords,bool yTileCoords)

{
  Make(__return_storage_ptr__,type,ptr,&dataWindow->min,
       ((long)(dataWindow->max).x - (long)(dataWindow->min).x) + 1,yStride,xStride,yStride,xSampling
       ,ySampling,fillValue,xTileCoords,yTileCoords);
  return __return_storage_ptr__;
}

Assistant:

Slice
Slice::Make (
    PixelType                     type,
    const void*                   ptr,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    size_t                        xStride,
    size_t                        yStride,
    int                           xSampling,
    int                           ySampling,
    double                        fillValue,
    bool                          xTileCoords,
    bool                          yTileCoords)
{
    return Make (
        type,
        ptr,
        dataWindow.min,
        static_cast<int64_t> (dataWindow.max.x) -
            static_cast<int64_t> (dataWindow.min.x) + 1,
        static_cast<int64_t> (dataWindow.max.y) -
            static_cast<int64_t> (dataWindow.min.y) + 1,
        xStride,
        yStride,
        xSampling,
        ySampling,
        fillValue,
        xTileCoords,
        yTileCoords);
}